

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

ActionMessage * __thiscall
helics::BaseTimeCoordinator::generateTimeRequest
          (BaseTimeCoordinator *this,TimeData *dep,GlobalFederateId fed,int32_t responseCode)

{
  BaseType BVar1;
  TimeRepresentation<count_time<9,_long>_> *pTVar2;
  TimeRepresentation<count_time<9,_long>_> TVar3;
  BaseType in_ECX;
  baseType *in_RDX;
  long in_RSI;
  ActionMessage *in_RDI;
  ActionMessage *nTime;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  action_t in_stack_ffffffffffffff7c;
  ActionMessage *in_stack_ffffffffffffff80;
  
  ActionMessage::ActionMessage(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  (in_RDI->source_id).gid = *(BaseType *)(in_RSI + 0x48);
  (in_RDI->dest_id).gid = in_ECX;
  (in_RDI->actionTime).internalTimeCode = *in_RDX;
  if ((*(byte *)((long)in_RDX + 0x32) & 1) != 0) {
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(in_RDI,interrupted_flag);
  }
  switch((char)in_RDX[6]) {
  case '\0':
    if ((int)in_RDX[8] == 0) {
      ActionMessage::setAction(in_RDI,cmd_ignore);
    }
    else {
      ActionMessage::setAction(in_RDI,cmd_exec_grant);
      BVar1 = GlobalFederateId::baseValue((GlobalFederateId *)(in_RDX + 5));
      ActionMessage::setExtraData
                ((ActionMessage *)CONCAT44(BVar1,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      setIterationFlags((ActionMessage *)CONCAT44(BVar1,in_stack_ffffffffffffff60),
                        (IterationRequest)((uint)in_stack_ffffffffffffff5c >> 0x18));
      in_RDI->counter = *(uint16_t *)(in_RSI + 0x4c);
      ActionMessage::setExtraDestData
                ((ActionMessage *)CONCAT44(BVar1,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
    }
    break;
  case '\x01':
    ActionMessage::setAction(in_RDI,cmd_exec_request);
    setIterationFlags((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                      ,(IterationRequest)((uint)in_stack_ffffffffffffff5c >> 0x18));
    GlobalFederateId::baseValue((GlobalFederateId *)(in_RDX + 5));
    ActionMessage::setExtraData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    in_RDI->counter = *(uint16_t *)(in_RSI + 0x4c);
    ActionMessage::setExtraDestData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    break;
  case '\x02':
    ActionMessage::setAction(in_RDI,cmd_exec_request);
    setIterationFlags((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                      ,(IterationRequest)((uint)in_stack_ffffffffffffff5c >> 0x18));
    GlobalFederateId::baseValue((GlobalFederateId *)(in_RDX + 5));
    ActionMessage::setExtraData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    in_RDI->counter = *(uint16_t *)(in_RSI + 0x4c);
    ActionMessage::setExtraDestData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    break;
  case '\x03':
    ActionMessage::setAction(in_RDI,cmd_exec_request);
    TVar3 = TimeRepresentation<count_time<9,_long>_>::zeroVal();
    (in_RDI->actionTime).internalTimeCode = TVar3.internalTimeCode;
    in_RDI->counter = *(uint16_t *)(in_RSI + 0x4c);
    ActionMessage::setExtraDestData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    break;
  case '\x05':
    ActionMessage::setAction(in_RDI,cmd_time_grant);
    break;
  case '\x06':
    GlobalFederateId::baseValue((GlobalFederateId *)(in_RDX + 5));
    ActionMessage::setExtraData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    setIterationFlags((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                      ,(IterationRequest)((uint)in_stack_ffffffffffffff5c >> 0x18));
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (TimeRepresentation<count_time<9,_long>_> *)0x583646);
    (in_RDI->Tdemin).internalTimeCode = pTVar2->internalTimeCode;
    in_RDI->counter = *(uint16_t *)(in_RSI + 0x4c);
    (in_RDI->Te).internalTimeCode = in_RDX[1];
    ActionMessage::setExtraDestData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    break;
  case '\a':
    GlobalFederateId::baseValue((GlobalFederateId *)(in_RDX + 5));
    ActionMessage::setExtraData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    setIterationFlags((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                      ,(IterationRequest)((uint)in_stack_ffffffffffffff5c >> 0x18));
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (TimeRepresentation<count_time<9,_long>_> *)0x5835ae);
    (in_RDI->Tdemin).internalTimeCode = pTVar2->internalTimeCode;
    (in_RDI->Te).internalTimeCode = in_RDX[1];
    in_RDI->counter = *(uint16_t *)(in_RSI + 0x4c);
    ActionMessage::setExtraDestData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    break;
  case '\b':
    GlobalFederateId::baseValue((GlobalFederateId *)(in_RDX + 5));
    ActionMessage::setExtraData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (TimeRepresentation<count_time<9,_long>_> *)0x583516);
    (in_RDI->Tdemin).internalTimeCode = pTVar2->internalTimeCode;
    (in_RDI->Te).internalTimeCode = in_RDX[1];
    in_RDI->counter = *(uint16_t *)(in_RSI + 0x4c);
    ActionMessage::setExtraDestData
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
    break;
  case '\n':
    ActionMessage::setAction(in_RDI,cmd_ignore);
  }
  return in_RDI;
}

Assistant:

ActionMessage BaseTimeCoordinator::generateTimeRequest(const TimeData& dep,
                                                       GlobalFederateId fed,
                                                       std::int32_t responseCode) const
{
    ActionMessage nTime(CMD_TIME_REQUEST);
    nTime.source_id = mSourceId;
    nTime.dest_id = fed;
    nTime.actionTime = dep.next;
    if (dep.interrupted) {
        setActionFlag(nTime, interrupted_flag);
    }
    switch (dep.mTimeState) {
        case TimeState::time_granted:
            nTime.setAction(CMD_TIME_GRANT);
            break;
        case TimeState::time_requested:
            nTime.setExtraData(dep.minFed.baseValue());
            nTime.Tdemin = std::min(dep.minDe, dep.Te);
            nTime.Te = dep.Te;
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::time_requested_iterative:
            nTime.setExtraData(dep.minFed.baseValue());
            setIterationFlags(nTime, IterationRequest::ITERATE_IF_NEEDED);
            nTime.Tdemin = std::min(dep.minDe, dep.Te);
            nTime.Te = dep.Te;
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::time_requested_require_iteration:
            nTime.setExtraData(dep.minFed.baseValue());
            setIterationFlags(nTime, IterationRequest::FORCE_ITERATION);
            nTime.Tdemin = std::min(dep.minDe, dep.Te);
            nTime.counter = sequenceCounter;
            nTime.Te = dep.Te;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::exec_requested:
            nTime.setAction(CMD_EXEC_REQUEST);
            nTime.actionTime = Time::zeroVal();
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::error:
            nTime.setAction(CMD_IGNORE);
            // no need to send updates for this
            break;
        case TimeState::exec_requested_iterative:
            nTime.setAction(CMD_EXEC_REQUEST);
            setIterationFlags(nTime, IterationRequest::ITERATE_IF_NEEDED);
            nTime.setExtraData(dep.minFed.baseValue());
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::exec_requested_require_iteration:
            nTime.setAction(CMD_EXEC_REQUEST);
            setIterationFlags(nTime, IterationRequest::FORCE_ITERATION);
            nTime.setExtraData(dep.minFed.baseValue());
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::initialized:
            if (dep.responseSequenceCounter == 0) {
                nTime.setAction(CMD_IGNORE);
            } else {
                nTime.setAction(CMD_EXEC_GRANT);
                nTime.setExtraData(dep.minFed.baseValue());
                setIterationFlags(nTime, IterationRequest::ITERATE_IF_NEEDED);
                nTime.counter = sequenceCounter;
                nTime.setExtraDestData(responseCode);
            }

            break;
    }

    return nTime;
}